

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall fasttext::QuantMatrix::addRowToVector(QuantMatrix *this,Vector *x,int32_t i,real a)

{
  int in_EDX;
  uint8_t *in_RSI;
  Vector *in_RDI;
  real in_XMM0_Da;
  ProductQuantizer *unaff_retaddr;
  real norm;
  undefined8 in_stack_ffffffffffffffc0;
  ProductQuantizer *in_stack_ffffffffffffffc8;
  Vector *x_00;
  
  x_00 = in_RDI;
  if ((in_RDI[5].data_.size_ & 1) != 0) {
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                *)0x1c19b4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 4),(long)in_EDX);
    ProductQuantizer::get_centroids
              (in_stack_ffffffffffffffc8,(int32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x18));
  }
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
              *)0x1c19f3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c1a10);
  ProductQuantizer::addcode(unaff_retaddr,x_00,in_RSI,in_EDX,in_XMM0_Da);
  return;
}

Assistant:

void QuantMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  real norm = 1;
  if (qnorm_) {
    norm = npq_->get_centroids(0, norm_codes_[i])[0];
  }
  pq_->addcode(x, codes_.data(), i, a * norm);
}